

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_http_result
          (connection<websocketpp::config::asio> *this)

{
  bool bVar1;
  value vVar2;
  ulong uVar3;
  string *psVar4;
  ostream *poVar5;
  element_type *this_00;
  string *search;
  element_type *peVar6;
  size_t in_RCX;
  ostream *__n;
  long in_RDI;
  string ua;
  stringstream s;
  string *in_stack_fffffffffffffbb0;
  allocator *paVar7;
  parser *in_stack_fffffffffffffbb8;
  string *replace;
  connection<websocketpp::config::asio::transport_config> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  undefined1 local_301 [33];
  string local_2e0 [32];
  string local_2c0 [39];
  allocator local_299;
  string local_298 [32];
  string local_278 [38];
  byte local_252;
  allocator local_251;
  string local_250 [32];
  string local_230 [37];
  byte local_20b;
  byte local_20a;
  allocator local_209;
  string local_208 [37];
  byte local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  undefined4 local_1a0;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  std::__cxx11::stringstream::stringstream(local_190);
  bVar1 = processor::is_websocket_handshake<websocketpp::http::parser::request>
                    ((request *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  if (bVar1) {
    peVar6 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x31fb4a);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar6,0x400,"Call to log_http_result for WebSocket",in_RCX);
    local_1a0 = 1;
  }
  else {
    __n = local_180;
    std::allocator<char>::allocator();
    local_1e3 = 0;
    local_20a = 0;
    local_20b = 0;
    std::__cxx11::string::string(local_1e0,"host",&local_1e1);
    http::parser::parser::get_header(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      local_20a = 1;
      std::__cxx11::string::string(local_208,"host",&local_209);
      local_20b = 1;
      psVar4 = http::parser::parser::get_header(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0)
      ;
      std::__cxx11::string::string(local_1c0,(string *)psVar4);
    }
    else {
      std::allocator<char>::allocator();
      local_1e3 = 1;
      std::__cxx11::string::string(local_1c0,"-",&local_1e2);
    }
    poVar5 = std::operator<<(local_180,local_1c0);
    poVar5 = std::operator<<(poVar5," ");
    transport::asio::connection<websocketpp::config::asio::transport_config>::
    get_remote_endpoint_abi_cxx11_(in_stack_fffffffffffffbf8);
    poVar5 = std::operator<<(poVar5,local_230);
    poVar5 = std::operator<<(poVar5," \"");
    psVar4 = http::parser::request::get_method_abi_cxx11_((request *)(in_RDI + 0x4ca0));
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5," ");
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x4e58));
    local_252 = 0;
    if (bVar1) {
      this_00 = std::__shared_ptr_access<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x31fe1f);
      psVar4 = uri::get_resource_abi_cxx11_(this_00);
      std::__cxx11::string::string(local_250,(string *)psVar4);
    }
    else {
      std::allocator<char>::allocator();
      local_252 = 1;
      std::__cxx11::string::string(local_250,"-",&local_251);
    }
    poVar5 = std::operator<<(poVar5,local_250);
    poVar5 = std::operator<<(poVar5," ");
    psVar4 = http::parser::parser::get_version_abi_cxx11_((parser *)(in_RDI + 0x4ca0));
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,"\" ");
    vVar2 = http::parser::response::get_status_code((response *)(in_RDI + 0x4d88));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,vVar2);
    poVar5 = std::operator<<(poVar5," ");
    http::parser::parser::get_body_abi_cxx11_((parser *)(in_RDI + 0x4d88));
    uVar3 = std::__cxx11::string::size();
    std::ostream::operator<<(poVar5,uVar3);
    std::__cxx11::string::~string(local_250);
    if ((local_252 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
    }
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_1c0);
    if ((local_20b & 1) != 0) {
      std::__cxx11::string::~string(local_208);
    }
    if ((local_20a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
    }
    if ((local_1e3 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
    }
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"User-Agent",&local_299);
    psVar4 = http::parser::parser::get_header(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::__cxx11::string::string(local_278,(string *)psVar4);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      search = (string *)std::operator<<(local_180," \"");
      std::__cxx11::string::string(local_2e0,local_278);
      replace = (string *)local_301;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_301 + 1),"\"",(allocator *)replace);
      paVar7 = &local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_328,"\\\"",paVar7);
      __n = (ostream *)local_328;
      utility::string_replace_all(psVar4,search,replace);
      poVar5 = std::operator<<((ostream *)search,local_2c0);
      std::operator<<(poVar5,"\" ");
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::__cxx11::string::~string((string *)(local_301 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_301);
      std::__cxx11::string::~string(local_2e0);
    }
    else {
      std::operator<<(local_180," \"\" ");
    }
    peVar6 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3204a1);
    std::__cxx11::stringstream::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar6,0x1000,local_350,(size_t)__n);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_278);
    local_1a0 = 0;
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void connection<config>::log_http_result() {
    std::stringstream s;

    if (processor::is_websocket_handshake(m_request)) {
        m_alog->write(log::alevel::devel,"Call to log_http_result for WebSocket");
        return;
    }  

    // Connection Type
    s << (m_request.get_header("host").empty() ? "-" : m_request.get_header("host"))
      << " " << transport_con_type::get_remote_endpoint()
      << " \"" << m_request.get_method() 
      << " " << (m_uri ? m_uri->get_resource() : "-") 
      << " " << m_request.get_version() << "\" " << m_response.get_status_code()
      << " " << m_response.get_body().size();
    
    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    m_alog->write(log::alevel::http,s.str());
}